

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

char * upb_MtDataEncoder_PutOneofField(upb_MtDataEncoder *e,char *ptr,uint32_t field_num)

{
  char *pcVar1;
  
  *(char **)e->internal = ptr;
  if ((*(int *)(e->internal + 0x14) == 2) &&
     (ptr = upb_MtDataEncoder_Put(e,ptr,'Y'), ptr == (char *)0x0)) {
    return (char *)0x0;
  }
  pcVar1 = upb_MtDataEncoder_PutBase92Varint(e,ptr,field_num,0x20,0x62);
  e->internal[0x14] = '\x02';
  e->internal[0x15] = '\0';
  e->internal[0x16] = '\0';
  e->internal[0x17] = '\0';
  return pcVar1;
}

Assistant:

char* upb_MtDataEncoder_PutOneofField(upb_MtDataEncoder* e, char* ptr,
                                      uint32_t field_num) {
  upb_MtDataEncoderInternal* in = upb_MtDataEncoder_GetInternal(e, ptr);
  if (in->state.msg_state.oneof_state == kUpb_OneofState_EmittedOneofField) {
    ptr = upb_MtDataEncoder_Put(
        e, ptr, _upb_FromBase92(kUpb_EncodedValue_FieldSeparator));
    if (!ptr) return NULL;
  }
  ptr = upb_MtDataEncoder_PutBase92Varint(e, ptr, field_num, _upb_ToBase92(0),
                                          _upb_ToBase92(63));
  in->state.msg_state.oneof_state = kUpb_OneofState_EmittedOneofField;
  return ptr;
}